

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O2

uint32_t sx_thread_tid(void)

{
  long lVar1;
  
  lVar1 = syscall(0xba);
  return (uint32_t)lVar1;
}

Assistant:

uint32_t sx_thread_tid(void)
{
#if SX_PLATFORM_WINDOWS
    return GetCurrentThreadId();
#elif SX_PLATFORM_LINUX || SX_PLATFORM_RPI || SX_PLATFORM_STEAMLINK
    return (pid_t)syscall(SYS_gettid);
#elif SX_PLATFORM_APPLE
    return (mach_port_t)pthread_mach_thread_np(pthread_self());
#elif SX_PLATFORM_BSD
    return *(uint32_t*)pthread_self();
#elif SX_PLATFORM_ANDROID
    return gettid();
#elif SX_PLATFORM_HURD
    return (pthread_t)pthread_self();
#else
    sx_assertf(0, "Tid not implemented");
#endif    // SX_PLATFORM_
}